

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O0

void __thiscall
tinyxml2::DynArray<tinyxml2::MemPoolT<104>::Block_*,_10>::EnsureCapacity
          (DynArray<tinyxml2::MemPoolT<104>::Block_*,_10> *this,int cap)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  Block **__dest;
  Block **newMem;
  int newAllocated;
  int cap_local;
  DynArray<tinyxml2::MemPoolT<104>::Block_*,_10> *this_local;
  
  if (this->_allocated < cap) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)(cap << 1);
    uVar2 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    __dest = (Block **)operator_new__(uVar2);
    memcpy(__dest,this->_mem,(long)this->_size << 3);
    if ((this->_mem != this->_pool) && (this->_mem != (Block **)0x0)) {
      operator_delete__(this->_mem);
    }
    this->_mem = __dest;
    this->_allocated = cap << 1;
  }
  return;
}

Assistant:

void EnsureCapacity(int cap)
    {
        TIXMLASSERT(cap > 0);
        if (cap > _allocated) {
            TIXMLASSERT(cap <= INT_MAX / 2);
            const int newAllocated = cap * 2;
            T* newMem = new T[newAllocated];
            TIXMLASSERT(newAllocated >= _size);
            memcpy(
                newMem,
                _mem,
                sizeof(T) * _size); // warning: not using constructors, only works for PODs
            if (_mem != _pool) {
                delete[] _mem;
            }
            _mem = newMem;
            _allocated = newAllocated;
        }
    }